

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

optional<pbrt::SquareMatrix<3>_> *
pbrt::LinearLeastSquares
          (optional<pbrt::SquareMatrix<3>_> *__return_storage_ptr__,Float (*A) [3],Float (*B) [3],
          int rows)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  Float FVar5;
  Float FVar6;
  Float FVar7;
  int i;
  Float *pFVar8;
  Float (*paFVar9) [3];
  undefined8 *puVar10;
  Float (*paFVar11) [3];
  long lVar12;
  Float *pFVar13;
  Float (*paFVar14) [3];
  int k;
  Float *pFVar15;
  int j;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 *puVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  optional<pbrt::SquareMatrix<3>_> AtAi;
  SquareMatrix<3> AtA;
  SquareMatrix<3> r_1;
  SquareMatrix<3> AtB;
  SquareMatrix<3> r;
  undefined1 local_f0 [36];
  char local_cc;
  SquareMatrix<3> local_c8;
  Float local_9c [2];
  undefined8 uStack_94;
  undefined8 uStack_8c;
  undefined8 uStack_84;
  undefined4 local_7c;
  undefined1 local_78 [32];
  undefined4 local_58;
  SquareMatrix<3> local_54;
  
  SquareMatrix<3>::SquareMatrix(&local_c8);
  lVar18 = 0;
  local_c8.m[2][2] = 0.0;
  local_c8.m[0][0] = 0.0;
  local_c8.m[0][1] = 0.0;
  local_c8.m[0][2] = 0.0;
  local_c8.m[1][0] = 0.0;
  local_c8.m[1][1] = 0.0;
  local_c8.m[1][2] = 0.0;
  local_c8.m[2][0] = 0.0;
  local_c8.m[2][1] = 0.0;
  SquareMatrix<3>::SquareMatrix((SquareMatrix<3> *)local_78);
  local_58 = 0;
  local_78 = ZEXT1632(ZEXT816(0) << 0x40);
  pFVar8 = *A;
  do {
    lVar12 = lVar18 * 0xc + -0x78;
    lVar16 = 0;
    pFVar13 = *B;
    pFVar15 = *A;
    do {
      if (0 < rows) {
        auVar25 = ZEXT464((uint)local_c8.m[lVar18][lVar16]);
        auVar24 = ZEXT464(*(uint *)(local_78 + lVar16 * 4 + lVar12 + 0x78));
        lVar17 = 0;
        do {
          auVar21 = vfmadd231ss_fma(auVar25._0_16_,ZEXT416(*(uint *)((long)pFVar8 + lVar17)),
                                    ZEXT416(*(uint *)((long)pFVar15 + lVar17)));
          auVar25 = ZEXT1664(auVar21);
          auVar4 = vfmadd231ss_fma(auVar24._0_16_,ZEXT416(*(uint *)((long)pFVar8 + lVar17)),
                                   ZEXT416(*(uint *)((long)pFVar13 + lVar17)));
          auVar24 = ZEXT1664(auVar4);
          lVar17 = lVar17 + 0xc;
        } while ((ulong)(uint)rows * 0xc != lVar17);
        local_c8.m[lVar18][lVar16] = auVar21._0_4_;
        *(int *)(local_78 + lVar16 * 4 + lVar12 + 0x78) = auVar4._0_4_;
      }
      lVar16 = lVar16 + 1;
      pFVar15 = pFVar15 + 1;
      pFVar13 = pFVar13 + 1;
    } while (lVar16 != 3);
    lVar18 = lVar18 + 1;
    pFVar8 = pFVar8 + 1;
  } while (lVar18 != 3);
  puVar19 = local_f0;
  Inverse<3>(&local_c8);
  if (local_cc == '\0') {
    *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  }
  else {
    SquareMatrix<3>::SquareMatrix(&local_54);
    lVar18 = 0;
    do {
      paFVar9 = local_54.m + lVar18;
      lVar12 = 0;
      paFVar11 = (Float (*) [3])local_78;
      do {
        (*paFVar9)[lVar12] = 0.0;
        auVar21 = ZEXT816(0) << 0x40;
        lVar16 = 0;
        paFVar14 = paFVar11;
        do {
          auVar21 = vfmadd231ss_fma(auVar21,ZEXT416(*(uint *)(puVar19 + lVar16 * 4)),
                                    ZEXT416((uint)(*(Float (*) [3])*paFVar14)[0]));
          lVar16 = lVar16 + 1;
          paFVar14 = paFVar14 + 1;
        } while (lVar16 != 3);
        (*paFVar9)[lVar12] = auVar21._0_4_;
        lVar12 = lVar12 + 1;
        paFVar11 = (Float (*) [3])(*paFVar11 + 1);
      } while (lVar12 != 3);
      lVar18 = lVar18 + 1;
      puVar19 = puVar19 + 0xc;
    } while (lVar18 != 3);
    paFVar11 = (Float (*) [3])local_9c;
    SquareMatrix<3>::SquareMatrix((SquareMatrix<3> *)paFVar11);
    auVar22 = vpbroadcastq_avx512vl();
    auVar22 = vpaddq_avx2(auVar22,_DAT_004671c0);
    lVar18 = 0;
    puVar10 = (undefined8 *)CONCAT71((int7)((ulong)paFVar9 >> 8),7);
    uVar20 = (ulong)puVar10 & 0xffffffff;
    do {
      auVar23 = vpbroadcastq_avx512vl();
      auVar23 = vpsllq_avx2(auVar23,2);
      vpaddq_avx2(auVar22,auVar23);
      auVar21 = vgatherqps_avx512vl(*puVar10);
      lVar12 = (ulong)((byte)uVar20 & 1) * auVar21._0_8_;
      FVar5 = (*(Float (*) [3])*paFVar11)[1];
      FVar6 = (*(Float (*) [3])*paFVar11)[2];
      FVar7 = paFVar11[1][0];
      bVar1 = (bool)((byte)uVar20 & 1);
      bVar2 = (bool)((byte)(uVar20 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
      (*(Float (*) [3])*paFVar11)[0] =
           (Float)((uint)bVar1 * (int)lVar12 | (uint)!bVar1 * (int)(*(Float (*) [3])*paFVar11)[0]);
      (*(Float (*) [3])*paFVar11)[1] =
           (Float)((uint)bVar2 * (int)((ulong)lVar12 >> 0x20) | (uint)!bVar2 * (int)FVar5);
      (*(Float (*) [3])*paFVar11)[2] =
           (Float)((uint)bVar3 * (uint)((byte)(uVar20 >> 1) & 1) * auVar21._8_4_ |
                  (uint)!bVar3 * (int)FVar6);
      paFVar11[1][0] = FVar7;
      lVar18 = lVar18 + 1;
      paFVar11 = paFVar11 + 1;
    } while (lVar18 != 3);
    __return_storage_ptr__->set = true;
    *(Float (*) [2])&__return_storage_ptr__->optionalValue = local_9c;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uStack_94;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uStack_8c;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = uStack_84;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_7c;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<SquareMatrix<3>> LinearLeastSquares(const Float A[][3], const Float B[][3],
                                                   int rows) {
    SquareMatrix<3> AtA = SquareMatrix<3>::Zero();
    SquareMatrix<3> AtB = SquareMatrix<3>::Zero();

    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            for (int r = 0; r < rows; ++r) {
                AtA[i][j] += A[r][i] * A[r][j];
                AtB[i][j] += A[r][i] * B[r][j];
            }

    auto AtAi = Inverse(AtA);
    if (!AtAi)
        return {};
    return Transpose(*AtAi * AtB);
}